

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_seek(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue obj;
  JSValue val_00;
  JSValue JVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  undefined4 in_ECX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  int32_t *in_R8;
  int ret;
  int whence;
  int64_t pos;
  FILE *f;
  JSContext *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  JSContext *in_stack_ffffffffffffff98;
  JSValueUnion in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  obj.tag = (int64_t)in_R8;
  obj.u.float64 = in_stack_ffffffffffffffa0.float64;
  __stream = (FILE *)js_std_file_get(in_stack_ffffffffffffff98,obj);
  if (__stream == (FILE *)0x0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    val.u._4_4_ = in_stack_ffffffffffffff94;
    val.u.int32 = in_stack_ffffffffffffff90;
    val.tag = (int64_t)in_stack_ffffffffffffff98;
    iVar2 = JS_ToInt64Ext(in_stack_ffffffffffffff88,(int64_t *)0x10ed7e,val);
    if (iVar2 == 0) {
      val_00.tag = in_RSI;
      val_00.u.float64 = in_RDI.float64;
      iVar2 = JS_ToInt32((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_R8,val_00);
      if (iVar2 == 0) {
        local_30 = fseeko(__stream,(__off_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        if (local_30 < 0) {
          piVar3 = __errno_location();
          local_30 = -*piVar3;
        }
        uStack_2c = uStack_c;
        local_28 = 0;
      }
      else {
        local_30 = 0;
        local_28 = 6;
      }
    }
    else {
      local_30 = 0;
      local_28 = 6;
    }
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_std_file_seek(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int64_t pos;
    int whence, ret;
    if (!f)
        return JS_EXCEPTION;
    if (JS_ToInt64Ext(ctx, &pos, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &whence, argv[1]))
        return JS_EXCEPTION;
#if defined(__linux__)
    ret = fseeko(f, pos, whence);
#else
    ret = fseek(f, pos, whence);
#endif
    if (ret < 0)
        ret = -errno;
    return JS_NewInt32(ctx, ret);
}